

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

char * ptls_hexdump(char *buf,void *_src,size_t len)

{
  char *pcVar1;
  long lVar2;
  char *dst;
  size_t sVar3;
  
  pcVar1 = buf;
  if (len != 0) {
    lVar2 = 0;
    sVar3 = 0;
    do {
      buf[sVar3 * 2] = "0123456789abcdef"[*(byte *)((long)_src + sVar3) >> 4];
      buf[sVar3 * 2 + 1] = "0123456789abcdef"[*(byte *)((long)_src + sVar3) & 0xf];
      sVar3 = sVar3 + 1;
      lVar2 = lVar2 + -2;
    } while (len != sVar3);
    buf = buf + -lVar2;
  }
  *buf = '\0';
  return pcVar1;
}

Assistant:

char *ptls_hexdump(char *buf, const void *_src, size_t len)
{
    char *dst = buf;
    const uint8_t *src = _src;
    size_t i;

    for (i = 0; i != len; ++i) {
        *dst++ = "0123456789abcdef"[src[i] >> 4];
        *dst++ = "0123456789abcdef"[src[i] & 0xf];
    }
    *dst++ = '\0';
    return buf;
}